

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O3

Class * __thiscall camp::UserObject::getClass(UserObject *this)

{
  NullObject *__return_storage_ptr__;
  string local_b0;
  string local_90;
  NullObject local_70;
  
  if (this->m_class != (Class *)0x0) {
    return this->m_class;
  }
  __return_storage_ptr__ = (NullObject *)__cxa_allocate_exception(0x48);
  NullObject::NullObject(&local_70,this->m_class);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/userobject.cpp"
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"const Class &camp::UserObject::getClass() const","");
  Error::prepare<camp::NullObject>(__return_storage_ptr__,&local_70,&local_b0,100,&local_90);
  __cxa_throw(__return_storage_ptr__,&NullObject::typeinfo,Error::~Error);
}

Assistant:

const Class& UserObject::getClass() const
{
    if (m_class)
    {
        return *m_class;
    }
    else
    {
        CAMP_ERROR(NullObject(m_class));
    }
}